

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O0

void __thiscall
CharStringType2Interpreter::~CharStringType2Interpreter(CharStringType2Interpreter *this)

{
  CharStringType2Interpreter *this_local;
  
  std::vector<CharStringOperand,_std::allocator<CharStringOperand>_>::~vector(&this->mStorage);
  std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::~list
            (&this->mOperandStack);
  return;
}

Assistant:

CharStringType2Interpreter::~CharStringType2Interpreter(void)
{
}